

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O1

BackgroundParser * BackgroundParser::New(ScriptContext *scriptContext)

{
  HeapAllocator *alloc;
  BackgroundParser *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_a37537b;
  data.filename._0_4_ = 0x2f;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_48);
  this = (BackgroundParser *)new<Memory::HeapAllocator>(0x78,alloc,0x300d4a);
  BackgroundParser(this,scriptContext);
  return this;
}

Assistant:

BackgroundParser * BackgroundParser::New(Js::ScriptContext *scriptContext)
{
    return HeapNew(BackgroundParser, scriptContext);
}